

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Token __thiscall slang::parsing::Preprocessor::nextProcessed(Preprocessor *this)

{
  TokenKind TVar1;
  SyntaxKind SVar2;
  Token token;
  Token local_18;
  
  local_18 = nextRaw(this);
  if (this->inMacroBody == false) {
    TVar1 = local_18.kind;
    if (TVar1 < MacroQuote) {
      if (TVar1 != Unknown) {
        if (TVar1 != Directive) {
          return local_18;
        }
        if (this->inIfDefCondition == true) {
          SVar2 = Token::directiveKind(&local_18);
          if ((SVar2 - ElseDirective < 0x40) &&
             ((0xa000000000000801U >> ((ulong)(SVar2 - ElseDirective) & 0x3f) & 1) != 0)) {
            return local_18;
          }
          if (SVar2 == ElsIfDirective) {
            return local_18;
          }
        }
      }
    }
    else if ((3 < TVar1 - 0x15a) && (TVar1 != LineContinuation)) {
      return local_18;
    }
    local_18 = handleDirectives(this,local_18);
  }
  return local_18;
}

Assistant:

Token Preprocessor::nextProcessed() {
    // The core preprocessing routine; this method pulls raw tokens from various text
    // files and converts them into a unified logical stream of sanitized tokens that
    // future stages like a parser can ingest without difficulty.
    //
    // Start off by grabbing the next raw token, either from the current file, an
    // active include file, or an expanded macro.
    auto token = nextRaw();

    // If we're currently within a macro body, return whatever we got right away.
    // If it was a directive it will be deferred until the macro is used.
    if (inMacroBody)
        return token;

    switch (token.kind) {
        // If we found a directive token, process it and pull another. We don't want
        // to return directives to the caller; we handle them ourselves and turn them
        // into trivia.
        case TokenKind::MacroQuote:
        case TokenKind::MacroTripleQuote:
        case TokenKind::MacroEscapedQuote:
        case TokenKind::MacroPaste:
        case TokenKind::LineContinuation:
        case TokenKind::Unknown:
            return handleDirectives(token);
        case TokenKind::Directive:
            if (inIfDefCondition) {
                switch (token.directiveKind()) {
                    case SyntaxKind::IfDefDirective:
                    case SyntaxKind::IfNDefDirective:
                    case SyntaxKind::ElsIfDirective:
                    case SyntaxKind::ElseDirective:
                    case SyntaxKind::EndIfDirective:
                        return token;
                    default:
                        break;
                }
            }
            return handleDirectives(token);
        default:
            return token;
    }
}